

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O3

string * vstring_printf_abi_cxx11_(string *__return_storage_ptr__,char *format,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  va_list args_copy;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28 = args->reg_save_area;
  local_38._0_4_ = args->gp_offset;
  local_38._4_4_ = args->fp_offset;
  pvStack_30 = args->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,format,&local_38);
  if (0 < (int)uVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,(ulong)uVar1,'\0');
    iVar2 = vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length + 1,format,args);
    if (iVar2 < 1) {
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    }
    uVar3 = (ulong)iVar2;
    if (__return_storage_ptr__->_M_string_length != uVar3) {
      if (__return_storage_ptr__->_M_string_length < uVar3) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
      __return_storage_ptr__->_M_string_length = uVar3;
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string vstring_printf(const char* format, va_list args) {
	std::string result;

	// Calculate size needed for formatted string
	va_list args_copy;
	va_copy(args_copy, args);
	int min_length = std::vsnprintf(nullptr, 0, format, args_copy);
	va_end(args_copy);

	if (min_length > 0) {
		result.resize(min_length);
		min_length = vsnprintf(result.data(), result.size() + 1, format, args);
		if (min_length <= 0) {
			result.clear();
		}

		if (result.size() != min_length) {
			// This should never happen; if it does, it's probably indicative of a race condition
			result.erase(min_length);
		}
	}

	return result;
}